

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O3

StmNode * __thiscall Canonicalizer::visit(Canonicalizer *this,JUMP *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar2;
  StmNode *left;
  JUMP *this_00;
  long *plVar3;
  ExprNode *pEVar4;
  undefined4 extraout_var_01;
  
  iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[5])(node);
  iVar1 = StmNode::getTypeStm((StmNode *)CONCAT44(extraout_var,iVar1));
  if (iVar1 == 7) {
    this->changed = true;
    iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[5])(node);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
    node = (JUMP *)operator_new(0x20);
    plVar2 = (long *)(**(code **)(*plVar3 + 0x20))(plVar3);
    left = (StmNode *)(**(code **)(*plVar2 + 0x18))(plVar2,this);
    this_00 = (JUMP *)operator_new(0x20);
    plVar3 = (long *)(**(code **)(*plVar3 + 0x28))(plVar3);
    pEVar4 = (ExprNode *)(**(code **)(*plVar3 + 0x18))(plVar3,this);
    JUMP::JUMP(this_00,pEVar4);
    SEQ::SEQ((SEQ *)node,left,(StmNode *)this_00);
  }
  else {
    iVar1 = (*(node->super_StmNode).super_ICTNode._vptr_ICTNode[5])(node);
    pEVar4 = (ExprNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var_01,iVar1),this);
    JUMP::setE(node,pEVar4);
  }
  return &node->super_StmNode;
}

Assistant:

StmNode *Canonicalizer::visit(JUMP *node) {
    if (node->getE()->getTypeStm() == V_ESEQ) {
        changed = true;
        ExprNode *eseq = node->getE();
        return new SEQ(eseq->getS()->accept(this), new JUMP(eseq->getE()->accept(this)));
    } else {
        node->setE(node->getE()->accept(this));
    }
    return node;
}